

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day04a.cpp
# Opt level: O2

int day4a::sum_of_real_rooms(string *input)

{
  bool bVar1;
  int iVar2;
  istream *piVar3;
  int iVar4;
  string line;
  string local_210;
  string checksum;
  string name;
  istringstream stream;
  
  std::__cxx11::istringstream::istringstream((istringstream *)&stream,(string *)input,_S_in);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  iVar4 = 0;
  while( true ) {
    piVar3 = std::operator>>((istream *)&stream,(string *)&line);
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
    name._M_dataplus._M_p = (pointer)&name.field_2;
    std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((string *)&name,line._M_dataplus._M_p,
               line._M_dataplus._M_p + (line._M_string_length - 0xb));
    checksum._M_dataplus._M_p = (pointer)&checksum.field_2;
    std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((string *)&checksum,line._M_dataplus._M_p + (line._M_string_length - 6),
               line._M_dataplus._M_p + (line._M_string_length - 1));
    bVar1 = is_real_room(&name,&checksum);
    if (bVar1) {
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((string *)&local_210,line._M_dataplus._M_p + (line._M_string_length - 10),
                 line._M_dataplus._M_p + (line._M_string_length - 7));
      iVar2 = std::__cxx11::stoi(&local_210,(size_t *)0x0,10);
      iVar4 = iVar4 + iVar2;
      std::__cxx11::string::~string((string *)&local_210);
    }
    std::__cxx11::string::~string((string *)&checksum);
    std::__cxx11::string::~string((string *)&name);
  }
  std::__cxx11::string::~string((string *)&line);
  std::__cxx11::istringstream::~istringstream((istringstream *)&stream);
  return iVar4;
}

Assistant:

int sum_of_real_rooms(const std::string& input) {
		std::istringstream stream(input);
		std::string line;
		int sum = 0;
		while(stream >> line) {
			std::string name{line.begin(), line.end() - 11};
			std::string checksum{line.end() - 6, line.end() - 1};
			if(is_real_room(name, checksum)) {
				sum += std::stoi(std::string{line.end() - 10, line.end() - 7});
			}
		}
		return sum;
	}